

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O3

size_t bakeBPACE_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t ec_d_00;
  size_t ec_d_01;
  
  sVar4 = ec_deep;
  sVar1 = beltHash_keep();
  sVar2 = beltECB_keep();
  sVar3 = beltECB_keep();
  sVar4 = bakeSWU2_deep(n,f_deep,ec_d_00,sVar4);
  sVar5 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar4 = utilMax(4,sVar3,sVar4,sVar5,f_deep);
  sVar3 = beltECB_keep();
  sVar5 = bakeSWU2_deep(n,f_deep,ec_d_01,sVar5);
  sVar6 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar7 = beltHash_keep();
  sVar8 = beltKRP_keep();
  sVar9 = beltMAC_keep();
  sVar3 = utilMax(7,f_deep,sVar3,sVar5,sVar6,sVar7,sVar8,sVar9);
  sVar5 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar6 = beltHash_keep();
  sVar7 = beltKRP_keep();
  sVar8 = beltMAC_keep();
  sVar5 = utilMax(5,f_deep,sVar5,sVar6,sVar7,sVar8);
  sVar6 = beltMAC_keep();
  sVar4 = utilMax(6,sVar1,sVar2,n * 0x10 + sVar4,sVar3 + n * 0x18,n * 0x18 + sVar5,sVar6 + 0x10);
  return sVar4;
}

Assistant:

static size_t bakeBPACE_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return utilMax(6,
		bakeBPACEStart_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep2_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep3_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep4_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep5_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep6_deep(n, f_deep, ec_d, ec_deep));
}